

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

int __thiscall icu_63::RuleBasedBreakIterator::init(RuleBasedBreakIterator *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  DictionaryCache *this_00;
  BreakCache *this_01;
  RuleBasedBreakIterator *size;
  DictionaryCache *pDVar3;
  void *pvVar2;
  
  this->fCharIter = (CharacterIterator *)0x0;
  this->fDone = '\0';
  this->fData = (RBBIDataWrapper *)0x0;
  this->fPosition = 0;
  this->fRuleStatusIndex = 0;
  this->fBreakCache = (BreakCache *)0x0;
  this->fDictionaryCache = (DictionaryCache *)0x0;
  this->fLanguageBreakEngines = (UStack *)0x0;
  this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
  this->fDictionaryCharCount = 0;
  pvVar2 = memcpy(&this->fText,&init::initializedUText,0x90);
  iVar1 = (int)pvVar2;
  if (*(int *)ctx < 1) {
    size = (RuleBasedBreakIterator *)0x0;
    utext_openUChars_63(&this->fText,(UChar *)0x0,0,(UErrorCode *)ctx);
    this_00 = (DictionaryCache *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
    pDVar3 = (DictionaryCache *)0x0;
    if (this_00 != (DictionaryCache *)0x0) {
      size = this;
      DictionaryCache::DictionaryCache(this_00,this,(UErrorCode *)ctx);
      pDVar3 = this_00;
    }
    this->fDictionaryCache = pDVar3;
    this_01 = (BreakCache *)UMemory::operator_new((UMemory *)0x340,(size_t)size);
    if (this_01 == (BreakCache *)0x0) {
      this_01 = (BreakCache *)0x0;
      iVar1 = 0;
    }
    else {
      BreakCache::BreakCache(this_01,this,(UErrorCode *)ctx);
      iVar1 = extraout_EAX;
    }
    this->fBreakCache = this_01;
    if ((*(int *)ctx < 1) &&
       ((this_01 == (BreakCache *)0x0 || (this->fDictionaryCache == (DictionaryCache *)0x0)))) {
      *(undefined4 *)ctx = 7;
    }
  }
  return iVar1;
}

Assistant:

void RuleBasedBreakIterator::init(UErrorCode &status) {
    fCharIter             = NULL;
    fData                 = NULL;
    fPosition             = 0;
    fRuleStatusIndex      = 0;
    fDone                 = false;
    fDictionaryCharCount  = 0;
    fLanguageBreakEngines = NULL;
    fUnhandledBreakEngine = NULL;
    fBreakCache           = NULL;
    fDictionaryCache      = NULL;

    // Note: IBM xlC is unable to assign or initialize member fText from UTEXT_INITIALIZER.
    // fText                 = UTEXT_INITIALIZER;
    static const UText initializedUText = UTEXT_INITIALIZER;
    uprv_memcpy(&fText, &initializedUText, sizeof(UText));

   if (U_FAILURE(status)) {
        return;
    }

    utext_openUChars(&fText, NULL, 0, &status);
    fDictionaryCache = new DictionaryCache(this, status);
    fBreakCache      = new BreakCache(this, status);
    if (U_SUCCESS(status) && (fDictionaryCache == NULL || fBreakCache == NULL)) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }

#ifdef RBBI_DEBUG
    static UBool debugInitDone = FALSE;
    if (debugInitDone == FALSE) {
        char *debugEnv = getenv("U_RBBIDEBUG");
        if (debugEnv && uprv_strstr(debugEnv, "trace")) {
            gTrace = TRUE;
        }
        debugInitDone = TRUE;
    }
#endif
}